

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O3

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddBox
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,double hx,
          double hy,double hz,ChVector<double> *pos,ChMatrix33<double> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ChCollisionShapeBullet *this_00;
  cbtCollisionShape *this_01;
  float fVar8;
  undefined4 uVar12;
  undefined8 in_XMM0_Qb;
  undefined1 auVar9 [16];
  undefined4 uVar11;
  undefined4 uVar13;
  undefined1 auVar10 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar14 [16];
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  cbtVector3 local_38;
  
  local_78 = hx;
  uStack_70 = in_XMM0_Qb;
  local_68 = hy;
  uStack_60 = in_XMM1_Qb;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x23])();
  auVar4._8_8_ = uStack_70;
  auVar4._0_8_ = local_78;
  auVar9._0_8_ = (double)SUB84(hx,0);
  auVar9._8_8_ = in_XMM0_Qb;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_68;
  auVar1 = vminsd_avx(auVar4,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = hz;
  auVar1 = vminsd_avx(auVar1,auVar2);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar1._0_8_ * 0.2;
  auVar1 = vminsd_avx(auVar9,auVar14);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])(auVar1._0_8_,this);
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  fVar8 = *(float *)&(material->
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
  uVar11 = *(undefined4 *)
            ((long)&(material->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr + 4);
  uVar12 = *(undefined4 *)
            &(material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  uVar13 = *(undefined4 *)
            ((long)&(material->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi + 4);
  p_Var3 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_88 = fVar8;
  uStack_84 = uVar11;
  uStack_80 = uVar12;
  uStack_7c = uVar13;
  ChCollisionShapeBullet::ChCollisionShapeBullet
            (this_00,BOX,(shared_ptr<chrono::ChMaterialSurface> *)&local_88);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_7c,uStack_80) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_7c,uStack_80));
  }
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  local_48 = fVar8;
  uStack_44 = uVar11;
  uStack_40 = uVar12;
  uStack_3c = uVar13;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  local_58 = fVar8;
  uStack_54 = uVar11;
  uStack_50 = uVar12;
  uStack_4c = uVar13;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  this_01 = (cbtCollisionShape *)cbtAlignedAllocInternal(0x50,0x10);
  auVar7._4_4_ = uStack_44;
  auVar7._0_4_ = local_48;
  auVar7._8_4_ = uStack_40;
  auVar7._12_4_ = uStack_3c;
  auVar5._8_8_ = uStack_70;
  auVar5._0_8_ = local_78;
  auVar1 = vinsertps_avx(auVar7,ZEXT416((uint)local_58),0x10);
  auVar6._8_8_ = uStack_60;
  auVar6._0_8_ = local_68;
  auVar2 = vunpcklpd_avx(auVar5,auVar6);
  auVar1 = vcvtps2pd_avx(auVar1);
  auVar10._0_8_ = auVar2._0_8_ + auVar1._0_8_;
  auVar10._8_8_ = auVar2._8_8_ + auVar1._8_8_;
  auVar1 = vcvtpd2ps_avx(auVar10);
  local_38.m_floats._0_8_ = vmovlps_avx(auVar1);
  local_38.m_floats[3] = 0.0;
  local_38.m_floats[2] = (float)((double)fVar8 + hz);
  cbtBoxShape::cbtBoxShape((cbtBoxShape *)this_01,&local_38);
  this_00->m_bt_shape = this_01;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  (*this_01->_vptr_cbtCollisionShape[0xb])(this_01);
  injectShape(this,pos,rot,this_00);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddBox(std::shared_ptr<ChMaterialSurface> material,
                                    double hx,
                                    double hy,
                                    double hz,
                                    const ChVector<>& pos,
                                    const ChMatrix33<>& rot) {
    // adjust default inward margin (if object too thin)
    SetSafeMargin(ChMin(GetSafeMargin(), 0.2 * ChMin(ChMin(hx, hy), hz)));

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::BOX, material);

    cbtScalar ahx = (cbtScalar)(hx + GetEnvelope());
    cbtScalar ahy = (cbtScalar)(hy + GetEnvelope());
    cbtScalar ahz = (cbtScalar)(hz + GetEnvelope());
    shape->m_bt_shape = new cbtBoxShape(cbtVector3(ahx, ahy, ahz));
    shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());

    injectShape(pos, rot, shape);
    return true;
}